

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgGridGlobal.cpp
# Opt level: O0

void __thiscall
TasGrid::GridGlobal::GridGlobal
          (GridGlobal *this,AccelerationContext *acc,GridGlobal *global,int ibegin,int iend)

{
  bool bVar1;
  type args;
  pointer this_00;
  unique_ptr<TasGrid::DynamicConstructorDataGlobal,_std::default_delete<TasGrid::DynamicConstructorDataGlobal>_>
  local_40 [3];
  int local_28;
  int local_24;
  int iend_local;
  int ibegin_local;
  GridGlobal *global_local;
  AccelerationContext *acc_local;
  GridGlobal *this_local;
  
  local_28 = iend;
  local_24 = ibegin;
  _iend_local = global;
  global_local = (GridGlobal *)acc;
  acc_local = (AccelerationContext *)this;
  BaseCanonicalGrid::BaseCanonicalGrid
            (&this->super_BaseCanonicalGrid,acc,&global->super_BaseCanonicalGrid,ibegin,iend);
  (this->super_BaseCanonicalGrid)._vptr_BaseCanonicalGrid = (_func_int **)&PTR__GridGlobal_003511b0;
  this->rule = _iend_local->rule;
  this->alpha = _iend_local->alpha;
  this->beta = _iend_local->beta;
  OneDimensionalWrapper::OneDimensionalWrapper(&this->wrapper,&_iend_local->wrapper);
  MultiIndexSet::MultiIndexSet(&this->tensors,&_iend_local->tensors);
  MultiIndexSet::MultiIndexSet(&this->active_tensors,&_iend_local->active_tensors);
  ::std::vector<int,_std::allocator<int>_>::vector(&this->active_w,&_iend_local->active_w);
  ::std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::vector(&this->tensor_refs,&_iend_local->tensor_refs);
  ::std::vector<int,_std::allocator<int>_>::vector(&this->max_levels,&_iend_local->max_levels);
  MultiIndexSet::MultiIndexSet(&this->updated_tensors,&_iend_local->updated_tensors);
  MultiIndexSet::MultiIndexSet(&this->updated_active_tensors,&_iend_local->updated_active_tensors);
  ::std::vector<int,_std::allocator<int>_>::vector
            (&this->updated_active_w,&_iend_local->updated_active_w);
  if (_iend_local->rule == rule_customtabulated) {
    CustomTabulated::CustomTabulated(&this->custom,&_iend_local->custom);
  }
  else {
    CustomTabulated::CustomTabulated(&this->custom);
  }
  ::std::
  unique_ptr<TasGrid::DynamicConstructorDataGlobal,std::default_delete<TasGrid::DynamicConstructorDataGlobal>>
  ::unique_ptr<std::default_delete<TasGrid::DynamicConstructorDataGlobal>,void>
            ((unique_ptr<TasGrid::DynamicConstructorDataGlobal,std::default_delete<TasGrid::DynamicConstructorDataGlobal>>
              *)&this->dynamic_values);
  ::std::
  unique_ptr<TasGrid::CudaGlobalData<double>,std::default_delete<TasGrid::CudaGlobalData<double>>>::
  unique_ptr<std::default_delete<TasGrid::CudaGlobalData<double>>,void>
            ((unique_ptr<TasGrid::CudaGlobalData<double>,std::default_delete<TasGrid::CudaGlobalData<double>>>
              *)&this->gpu_cache);
  ::std::
  unique_ptr<TasGrid::CudaGlobalData<float>,std::default_delete<TasGrid::CudaGlobalData<float>>>::
  unique_ptr<std::default_delete<TasGrid::CudaGlobalData<float>>,void>
            ((unique_ptr<TasGrid::CudaGlobalData<float>,std::default_delete<TasGrid::CudaGlobalData<float>>>
              *)&this->gpu_cachef);
  bVar1 = ::std::unique_ptr::operator_cast_to_bool((unique_ptr *)&_iend_local->dynamic_values);
  if (bVar1) {
    args = ::std::
           unique_ptr<TasGrid::DynamicConstructorDataGlobal,_std::default_delete<TasGrid::DynamicConstructorDataGlobal>_>
           ::operator*(&_iend_local->dynamic_values);
    Utils::make_unique<TasGrid::DynamicConstructorDataGlobal,TasGrid::DynamicConstructorDataGlobal&>
              ((Utils *)local_40,args);
    ::std::
    unique_ptr<TasGrid::DynamicConstructorDataGlobal,_std::default_delete<TasGrid::DynamicConstructorDataGlobal>_>
    ::operator=(&this->dynamic_values,local_40);
    ::std::
    unique_ptr<TasGrid::DynamicConstructorDataGlobal,_std::default_delete<TasGrid::DynamicConstructorDataGlobal>_>
    ::~unique_ptr(local_40);
    if ((this->super_BaseCanonicalGrid).num_outputs !=
        (_iend_local->super_BaseCanonicalGrid).num_outputs) {
      this_00 = ::std::
                unique_ptr<TasGrid::DynamicConstructorDataGlobal,_std::default_delete<TasGrid::DynamicConstructorDataGlobal>_>
                ::operator->(&this->dynamic_values);
      DynamicConstructorDataGlobal::restrictData(this_00,local_24,local_28);
    }
  }
  return;
}

Assistant:

GridGlobal::GridGlobal(AccelerationContext const *acc, GridGlobal const *global, int ibegin, int iend) :
    BaseCanonicalGrid(acc, *global, ibegin, iend),
    rule(global->rule),
    alpha(global->alpha),
    beta(global->beta),
    wrapper(global->wrapper),
    tensors(global->tensors),
    active_tensors(global->active_tensors),
    active_w(global->active_w),
    tensor_refs(global->tensor_refs),
    max_levels(global->max_levels),
    updated_tensors(global->updated_tensors),
    updated_active_tensors(global->updated_active_tensors),
    updated_active_w(global->updated_active_w),
    custom((global->rule == rule_customtabulated) ? global->custom : CustomTabulated()){

    if (global->dynamic_values){
        dynamic_values = Utils::make_unique<DynamicConstructorDataGlobal>(*global->dynamic_values);
        if (num_outputs != global->num_outputs) dynamic_values->restrictData(ibegin, iend);
    }
}